

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout_p.h
# Opt level: O0

QDockAreaLayout * __thiscall
QDockAreaLayout::operator=(QDockAreaLayout *this,QDockAreaLayout *param_2)

{
  void *in_RSI;
  QDockAreaLayout *in_RDI;
  unsigned_long __i0;
  QDockAreaLayoutInfo *in_stack_ffffffffffffffd8;
  long local_18;
  
  memcpy(in_RDI,in_RSI,0x40);
  for (local_18 = 0; local_18 != 4; local_18 = local_18 + 1) {
    QDockAreaLayoutInfo::operator=((QDockAreaLayoutInfo *)in_RDI,in_stack_ffffffffffffffd8);
  }
  in_RDI->sep = *(int *)((long)in_RSI + 0x200);
  in_RDI->fallbackToSizeHints = *(bool *)((long)in_RSI + 0x204);
  QList<QWidget_*>::operator=
            ((QList<QWidget_*> *)in_RDI,(QList<QWidget_*> *)in_stack_ffffffffffffffd8);
  return in_RDI;
}

Assistant:

class Q_AUTOTEST_EXPORT QDockAreaLayout
{
public:
    enum { EmptyDropAreaSize = 80 }; // when a dock area is empty, how "wide" is it?

    Qt::DockWidgetArea corners[4]; // use a Qt::Corner for indexing
    QRect rect;
    QLayoutItem *centralWidgetItem;
    QMainWindow *mainWindow;
    QRect centralWidgetRect;
    QDockAreaLayout(QMainWindow *win);
    QDockAreaLayoutInfo docks[4];
    int sep; // margin between a dock widget and its frame
    bool fallbackToSizeHints; //determines if we should use the sizehint for the dock areas (true until the layout is restored or the separator is moved by user)
    mutable QList<QWidget *> separatorWidgets;

    bool isValid() const;

    enum { DockWidgetStateMarker = 0xfd, FloatingDockWidgetTabMarker = 0xf9 };
    static QRect constrainedRect(QRect rect, QWidget *widget);
    void saveState(QDataStream &stream) const;
    bool restoreState(QDataStream &stream, const QList<QDockWidget*> &widgets, bool testing = false);

    QList<int> indexOfPlaceHolder(const QString &objectName) const;
    QList<int> indexOf(const QWidget *dockWidget) const;
    QList<int> gapIndex(const QPoint &pos, bool disallowTabs) const;
    QList<int> findSeparator(const QPoint &pos) const;

    QDockAreaLayoutItem &item(const QList<int> &path);
    QDockAreaLayoutInfo *info(const QList<int> &path);
    const QDockAreaLayoutInfo *info(const QList<int> &path) const;
    QDockAreaLayoutInfo *info(QWidget *widget);
    QRect itemRect(const QList<int> &path) const;
    QRect separatorRect(int index) const;
    QRect separatorRect(const QList<int> &path) const;

    bool insertGap(const QList<int> &path, QLayoutItem *dockWidgetItem);
    QLayoutItem *plug(const QList<int> &path);
    QLayoutItem *unplug(const QList<int> &path);
    void remove(const QList<int> &path);
    void removePlaceHolder(const QString &name);

    void fitLayout();

    void clear();

    QSize sizeHint() const;
    QSize minimumSize() const;
    QSize minimumStableSize() const;
    template<typename SizePMF, typename CenterPMF>
    QSize size_helper(SizePMF sizeFn, CenterPMF centerFn) const;

    void addDockWidget(QInternal::DockPosition pos, QDockWidget *dockWidget, Qt::Orientation orientation);
    bool restoreDockWidget(QDockWidget *dockWidget);
    void splitDockWidget(QDockWidget *after, QDockWidget *dockWidget,
                         Qt::Orientation orientation);
#if QT_CONFIG(tabbar)
    void tabifyDockWidget(QDockWidget *first, QDockWidget *second);
#endif
    void resizeDocks(const QList<QDockWidget *> &docks, const QList<int> &sizes, Qt::Orientation o);

    void apply(bool animate);

    void paintSeparators(QPainter *p, QWidget *widget, const QRegion &clip,
                            const QPoint &mouse) const;
    QRegion separatorRegion() const;
    int separatorMove(const QList<int> &separator, const QPoint &origin, const QPoint &dest);
#if QT_CONFIG(tabbar)
    void updateSeparatorWidgets() const;
#endif // QT_CONFIG(tabbar)

    QLayoutItem *itemAt(int *x, int index) const;
    QLayoutItem *takeAt(int *x, int index);
    void deleteAllLayoutItems();

    void getGrid(QList<QLayoutStruct> *ver_struct_list, QList<QLayoutStruct> *hor_struct_list);
    void setGrid(QList<QLayoutStruct> *ver_struct_list, QList<QLayoutStruct> *hor_struct_list);

    QRect gapRect(const QList<int> &path) const;
    QRect gapRect(QInternal::DockPosition dockPos) const;

    void keepSize(QDockWidget *w);
#if QT_CONFIG(tabbar)
    QSet<QTabBar*> usedTabBars() const;
    QSet<QWidget*> usedSeparatorWidgets() const;
#endif // QT_CONFIG(tabbar)
    void styleChangedEvent();
}